

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O3

ktx_error_code_e ktxHashList_Deserialize(ktxHashList *pHead,uint kvdLen,void *pKvd)

{
  uint *key;
  ktx_error_code_e kVar1;
  char *value;
  uint uVar2;
  char *src;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint *puVar6;
  undefined1 auVar7 [16];
  
  kVar1 = KTX_INVALID_VALUE;
  if ((((pHead != (ktxHashList *)0x0) && (kvdLen != 0)) && (pKvd != (void *)0x0)) &&
     (kVar1 = KTX_INVALID_OPERATION, *pHead == (ktxHashList)0x0)) {
    puVar6 = (uint *)((ulong)kvdLen + (long)pKvd);
    while( true ) {
      kVar1 = KTX_FILE_DATA_ERROR;
      if (puVar6 < (uint *)((long)pKvd + 6U)) break;
      uVar2 = *pKvd;
      uVar5 = (ulong)uVar2;
      if (puVar6 < (uint *)((long)pKvd + uVar5 + 4)) {
        return KTX_FILE_DATA_ERROR;
      }
      key = (uint *)((long)pKvd + 4);
      uVar4 = 0;
      if (uVar5 != 0) {
        while (*(char *)((long)key + uVar4) != '\0') {
          uVar4 = uVar4 + 1;
          if (uVar5 == uVar4) {
            return KTX_FILE_DATA_ERROR;
          }
        }
      }
      uVar3 = (uint)uVar4;
      if (uVar3 == uVar2) {
        return KTX_FILE_DATA_ERROR;
      }
      if (*(char *)((long)key + (uVar4 & 0xffffffff)) != '\0') {
        return KTX_FILE_DATA_ERROR;
      }
      if (((2 < uVar3) && ((char)*key == -0x11)) &&
         ((*(char *)((long)pKvd + 5) == -0x45 && (*(char *)((long)pKvd + 6U) == -0x41)))) {
        return KTX_FILE_DATA_ERROR;
      }
      uVar2 = uVar2 - (uVar3 + 1);
      value = (char *)((long)key + (ulong)(uVar3 + 1));
      if (uVar2 == 0) {
        value = (char *)0x0;
      }
      kVar1 = ktxHashList_AddKVPair(pHead,(char *)key,uVar2,value);
      if (kVar1 != KTX_SUCCESS) {
        return kVar1;
      }
      auVar7 = roundss(ZEXT416((uint)((float)uVar5 * 0.25)),ZEXT416((uint)((float)uVar5 * 0.25)),10)
      ;
      pKvd = (void *)((long)key + ((long)(auVar7._0_4_ * 4.0) & 0xffffffffU));
      if (puVar6 <= pKvd) {
        return KTX_SUCCESS;
      }
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxHashList_Deserialize(ktxHashList* pHead, unsigned int kvdLen, void* pKvd)
{
    char* src = pKvd;
    KTX_error_code result;

    if (kvdLen == 0 || pKvd == NULL || pHead == NULL)
        return KTX_INVALID_VALUE;

    if (*pHead != NULL)
        return KTX_INVALID_OPERATION;

    result = KTX_SUCCESS;
    while (result == KTX_SUCCESS && src < (char *)pKvd + kvdLen) {
        if (src + 6 > (char *)pKvd + kvdLen) {
            // Not enough space for another entry
            return KTX_FILE_DATA_ERROR;
        }

        char* key;
        unsigned int keyLen, valueLen;
        void* value;
        ktx_uint32_t keyAndValueByteSize = *((ktx_uint32_t*)src);

        if (src + 4 + keyAndValueByteSize > (char *)pKvd + kvdLen) {
            // Not enough space for this entry
            return KTX_FILE_DATA_ERROR;
        }

        src += sizeof(keyAndValueByteSize);
        key = src;
        keyLen = 0;

        while (keyLen < keyAndValueByteSize && key[keyLen] != '\0') keyLen++;

        if (keyLen == keyAndValueByteSize || key[keyLen] != '\0') {
            // Missing NULL terminator or no value
            return KTX_FILE_DATA_ERROR;
        }

        if (keyLen >= 3 && key[0] == '\xEF' && key[1] == '\xBB' && key[2] == '\xBF') {
            // Forbidden BOM
            return KTX_FILE_DATA_ERROR;
        }

        keyLen += 1;
        value = key + keyLen;

        valueLen = keyAndValueByteSize - keyLen;
        result = ktxHashList_AddKVPair(pHead, key, valueLen,
                                       valueLen > 0 ? value : NULL);
        if (result == KTX_SUCCESS) {
            src += _KTX_PAD4(keyAndValueByteSize);
        }
    }
    return result;
}